

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateInlineMethods
          (MessageGenerator *this,Printer *p)

{
  Descriptor *desc;
  ushort *puVar1;
  bool bVar2;
  value_type desc_00;
  AlphaNum *pAVar3;
  long lVar4;
  cpp *this_00;
  undefined1 cap_next_letter;
  char *in_R8;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  string_view input;
  allocator<char> local_607;
  allocator<char> local_606;
  allocator<char> local_605;
  int local_604;
  Printer *local_600;
  string local_5f8;
  string local_5d8;
  Iterator __end3;
  Iterator __begin3;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  string local_568;
  string local_548;
  string local_528;
  AlphaNum local_508;
  AlphaNum *local_4d8;
  pointer local_4d0;
  string local_4a8;
  AlphaNum local_488;
  ulong local_458;
  AlphaNum *local_450;
  AnnotationRecord local_428;
  Sub local_3e8 [4];
  Options local_108;
  
  desc = this->descriptor_;
  Options::Options(&local_108,&this->options_);
  cpp::anon_unknown_0::ClassVars
            ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)local_3e8,desc,&local_108);
  vars.len_ = (long)(local_3e8[0].key_._M_string_length - (long)local_3e8[0].key_._M_dataplus._M_p)
              / 0xb8;
  vars.ptr_ = (pointer)local_3e8[0].key_._M_dataplus._M_p;
  io::Printer::WithVars(&v,p,vars);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_3e8);
  Options::~Options(&local_108);
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)local_3e8,this->descriptor_,&this->options_);
  vars_00.len_ = (long)(local_3e8[0].key_._M_string_length -
                       (long)local_3e8[0].key_._M_dataplus._M_p) / 0xb8;
  vars_00.ptr_ = (pointer)local_3e8[0].key_._M_dataplus._M_p;
  io::Printer::WithVars(&t,p,vars_00);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_3e8);
  if ((this->descriptor_->options_->field_0)._impl_.map_entry_ == false) {
    local_600 = p;
    GenerateFieldAccessorDefinitions(this,p);
    __end3.descriptor = this->descriptor_;
    __begin3.idx = 0;
    __end3.idx = (__end3.descriptor)->real_oneof_decl_count_;
    __begin3.descriptor = __end3.descriptor;
    while( true ) {
      cap_next_letter = SUB81(in_R8,0);
      bVar2 = cpp::operator!=(&__begin3,&__end3);
      if (!bVar2) break;
      desc_00 = OneOfRangeImpl::Iterator::operator*(&__begin3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5d8,"oneof_name",&local_605);
      puVar1 = (ushort *)(desc_00->all_names_).payload_;
      local_458 = (ulong)*puVar1;
      pAVar3 = (AlphaNum *)((long)puVar1 + ~local_458);
      local_450 = pAVar3;
      local_488.piece_ = absl::lts_20250127::NullSafeStringView("_case");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_528,(lts_20250127 *)&local_458,&local_488,pAVar3)
      ;
      io::Printer::Sub::Sub<std::__cxx11::string>(local_3e8 + 3,&local_5d8,&local_528);
      io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::OneofDescriptor,_0>
                (&local_428,desc_00,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      io::Printer::Sub::AnnotatedAs(local_3e8,local_3e8 + 3,&local_428);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"OneofName",&local_606);
      puVar1 = (ushort *)(desc_00->all_names_).payload_;
      this_00 = (cpp *)(ulong)*puVar1;
      input._M_len = (long)puVar1 + ~(ulong)this_00;
      input._M_str = (char *)0x1;
      UnderscoresToCamelCase_abi_cxx11_(&local_5f8,this_00,input,(bool)cap_next_letter);
      local_4d8 = (AlphaNum *)local_5f8._M_string_length;
      local_4d0 = local_5f8._M_dataplus._M_p;
      pAVar3 = (AlphaNum *)local_5f8._M_string_length;
      local_508.piece_ = absl::lts_20250127::NullSafeStringView("Case");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_548,(lts_20250127 *)&local_4d8,&local_508,pAVar3)
      ;
      io::Printer::Sub::Sub<std::__cxx11::string>(local_3e8 + 1,&local_4a8,&local_548);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_568,"oneof_index",&local_607);
      local_604 = (int)(((long)desc_00 - (long)desc_00->containing_type_->oneof_decls_) / 0x38);
      io::Printer::Sub::Sub<int>(local_3e8 + 2,&local_568,&local_604);
      in_R8 = 
      "\n          inline $classname$::$OneofName$ $classname$::$oneof_name$() const {\n            return $classname$::$OneofName$($oneof_case$[$oneof_index$]);\n          }\n        "
      ;
      io::Printer::Emit(local_600,local_3e8,3,0xad);
      lVar4 = 0x170;
      do {
        io::Printer::Sub::~Sub((Sub *)((long)&local_3e8[0].key_._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0xb8;
      } while (lVar4 != -0xb8);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::__cxx11::string::~string((string *)&local_4a8);
      io::Printer::AnnotationRecord::~AnnotationRecord(&local_428);
      io::Printer::Sub::~Sub(local_3e8 + 3);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_5d8);
      __begin3.idx = __begin3.idx + 1;
    }
  }
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&t);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v);
  return;
}

Assistant:

void MessageGenerator::GenerateInlineMethods(io::Printer* p) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  if (IsMapEntryMessage(descriptor_)) return;
  GenerateFieldAccessorDefinitions(p);

  // Generate oneof_case() functions.
  for (auto oneof : OneOfRange(descriptor_)) {
    p->Emit(
        {
            Sub{"oneof_name", absl::StrCat(oneof->name(), "_case")}.AnnotatedAs(
                oneof),
            {"OneofName",
             absl::StrCat(UnderscoresToCamelCase(oneof->name(), true), "Case")},
            {"oneof_index", oneof->index()},
        },
        R"cc(
          inline $classname$::$OneofName$ $classname$::$oneof_name$() const {
            return $classname$::$OneofName$($oneof_case$[$oneof_index$]);
          }
        )cc");
  }
}